

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Matrix<double>::get(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                   Matrix<double> *this,uint row)

{
  const_reference __x;
  uint row_local;
  Matrix<double> *this_local;
  
  if ((this->m_shape).n_row <= row) {
    std::operator<<((ostream *)&std::cout,"ERROR [get]: Row limit exceeded!\n");
    exit(1);
  }
  __x = std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&this->m_elems,(ulong)row);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Matrix<T>::get(unsigned row) const{
    if(row>=m_shape.n_row){
        std::cout<<"ERROR [get]: Row limit exceeded!\n";
        exit(1);
    }
    return m_elems[row];
}